

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O3

bool __thiscall
sptk::StatisticsAccumulation::Merge
          (StatisticsAccumulation *this,int num_data,vector<double,_std::allocator<double>_> *first,
          SymmetricMatrix *second,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  pointer pdVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  size_type __new_size;
  long lVar10;
  int iVar11;
  bool bVar12;
  ulong uVar13;
  int column;
  double dVar14;
  Row local_90;
  double local_78;
  double local_70;
  pointer local_68;
  SymmetricMatrix *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  SymmetricMatrix *local_50;
  Row local_48;
  
  bVar12 = false;
  if (((buffer != (Buffer *)0x0) && (bVar12 = false, 0 < num_data)) && (this->is_valid_ != false)) {
    __new_size = (long)this->num_order_ + 1;
    if ((this->num_statistics_order_ < 1) ||
       (((long)(first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3 == __new_size &&
        ((this->num_statistics_order_ == 1 || (second->num_dimension_ == (int)__new_size)))))) {
      if (buffer->zeroth_order_statistics_ == 0) {
        buffer->zeroth_order_statistics_ = num_data;
        if ((first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<double,_std::allocator<double>_>::operator=
                    (&buffer->first_order_statistics_,first);
        }
        bVar12 = true;
        if (second->num_dimension_ != 0) {
          SymmetricMatrix::operator=(&buffer->second_order_statistics_,second);
        }
      }
      else {
        this_00 = &buffer->delta_;
        local_58 = first;
        if (this->numerically_stable_ == false) {
          local_68 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
        }
        else {
          local_68 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if ((long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)local_68 >> 3 != __new_size) {
            std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
            local_68 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
          }
          pdVar7 = (buffer->first_order_statistics_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (buffer->first_order_statistics_).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pdVar7 != pdVar5) {
            pdVar6 = (first->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar10 = 0;
            do {
              pdVar8 = (double *)((long)pdVar7 + lVar10);
              *(double *)((long)local_68 + lVar10) = *pdVar8 - *(double *)((long)pdVar6 + lVar10);
              lVar10 = lVar10 + 8;
            } while (pdVar8 + 1 != pdVar5);
          }
        }
        pdVar6 = local_68;
        local_70 = (double)buffer->zeroth_order_statistics_;
        local_78 = (double)num_data + local_70;
        buffer->zeroth_order_statistics_ = buffer->zeroth_order_statistics_ + num_data;
        if (second->num_dimension_ != 0) {
          local_60 = second;
          if (this->numerically_stable_ == false) {
            if (-1 < this->num_order_) {
              iVar11 = 0;
              do {
                column = 0;
                if (this->diagonal_ != false) {
                  column = iVar11;
                }
                do {
                  local_90._vptr_Row = (_func_int **)&PTR__Row_00111d28;
                  local_90.matrix_ = second;
                  local_90.row_ = iVar11;
                  pdVar7 = SymmetricMatrix::Row::operator[](&local_90,column);
                  dVar14 = *pdVar7;
                  local_48._vptr_Row = (_func_int **)&PTR__Row_00111d28;
                  local_48.matrix_ = &buffer->second_order_statistics_;
                  local_48.row_ = iVar11;
                  pdVar7 = SymmetricMatrix::Row::operator[](&local_48,column);
                  *pdVar7 = dVar14 + *pdVar7;
                  column = column + 1;
                } while (iVar11 + 1 != column);
                bVar12 = iVar11 < this->num_order_;
                iVar11 = iVar11 + 1;
              } while (bVar12);
            }
          }
          else if (-1 < this->num_order_) {
            dVar14 = ((double)num_data * local_70) / local_78;
            uVar13 = 0;
            local_50 = &buffer->second_order_statistics_;
            do {
              uVar9 = uVar13 & 0xffffffff;
              if (this->diagonal_ == false) {
                uVar9 = 0;
              }
              do {
                local_90._vptr_Row = (_func_int **)&PTR__Row_00111d28;
                local_90.matrix_ = local_60;
                local_90.row_ = (int)uVar13;
                pdVar7 = SymmetricMatrix::Row::operator[](&local_90,(int)uVar9);
                dVar2 = *pdVar7;
                dVar3 = pdVar6[uVar13];
                dVar4 = pdVar6[uVar9];
                local_90._vptr_Row = (_func_int **)&PTR__Row_00111d28;
                local_90.matrix_ = &buffer->second_order_statistics_;
                local_90.row_ = (int)uVar13;
                pdVar7 = SymmetricMatrix::Row::operator[](&local_90,(int)uVar9);
                *pdVar7 = dVar3 * dVar14 * dVar4 + dVar2 + *pdVar7;
                uVar9 = uVar9 + 1;
              } while (uVar13 + 1 != uVar9);
              bVar12 = (long)uVar13 < (long)this->num_order_;
              uVar13 = uVar13 + 1;
            } while (bVar12);
          }
        }
        pdVar7 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (local_58->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        bVar12 = true;
        if (pdVar7 != pdVar5) {
          if (this->numerically_stable_ == true) {
            pdVar5 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar8 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (pdVar5 != pdVar8) {
              pdVar6 = (buffer->first_order_statistics_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar10 = 0;
              do {
                pdVar1 = (double *)((long)pdVar5 + lVar10);
                *(double *)((long)pdVar6 + lVar10) =
                     *pdVar1 * (local_70 / local_78) + *(double *)((long)pdVar7 + lVar10);
                lVar10 = lVar10 + 8;
              } while (pdVar1 + 1 != pdVar8);
            }
          }
          else {
            pdVar8 = (buffer->first_order_statistics_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              *pdVar8 = *pdVar7 + *pdVar8;
              pdVar7 = pdVar7 + 1;
              pdVar8 = pdVar8 + 1;
            } while (pdVar7 != pdVar5);
          }
        }
      }
    }
    else {
      bVar12 = false;
    }
  }
  return bVar12;
}

Assistant:

bool StatisticsAccumulation::Merge(
    int num_data, const std::vector<double>& first,
    const SymmetricMatrix& second,
    StatisticsAccumulation::Buffer* buffer) const {
  if (!is_valid_ || num_data <= 0 || NULL == buffer) {
    return false;
  }

  const std::size_t length(num_order_ + 1);
  if (1 <= num_statistics_order_ && first.size() != length) {
    return false;
  }
  if (2 <= num_statistics_order_ &&
      second.GetNumDimension() != static_cast<int>(length)) {
    return false;
  }

  // Copy statistics if the buffer is empty.
  if (0 == buffer->zeroth_order_statistics_) {
    buffer->zeroth_order_statistics_ = num_data;
    if (!first.empty()) buffer->first_order_statistics_ = first;
    if (!second.Empty()) buffer->second_order_statistics_ = second;
    return true;
  }

  // Compute delta.
  if (numerically_stable_) {
    if (buffer->delta_.size() != length) {
      buffer->delta_.resize(length);
    }
    std::transform(buffer->first_order_statistics_.begin(),
                   buffer->first_order_statistics_.end(), first.begin(),
                   buffer->delta_.begin(), std::minus<double>());
  }
  const double* delta(&(buffer->delta_[0]));

  const double m(static_cast<double>(buffer->zeroth_order_statistics_));
  const double n(static_cast<double>(num_data));
  const double mpn(m + n);
  const double mn(m * n);
  buffer->zeroth_order_statistics_ += num_data;

  // Merge 2nd order statistics.
  if (!second.Empty()) {
    if (numerically_stable_) {
      const double c(mn / mpn);
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          const double term1(second[i][j]);
          const double term2(c * delta[i] * delta[j]);
          buffer->second_order_statistics_[i][j] += term1 + term2;
        }
      }
    } else {
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += second[i][j];
        }
      }
    }
  }

  // Merge 1st order statistics.
  if (!first.empty()) {
    if (numerically_stable_) {
      const double c(m / mpn);
      std::transform(buffer->delta_.begin(), buffer->delta_.end(),
                     first.begin(), buffer->first_order_statistics_.begin(),
                     [c](double x, double y) { return c * x + y; });
    } else {
      std::transform(
          first.begin(), first.end(), buffer->first_order_statistics_.begin(),
          buffer->first_order_statistics_.begin(), std::plus<double>());
    }
  }

  return true;
}